

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum256.c
# Opt level: O0

void areduction(uint64_t *n,uint64_t nInv,uint64_t *c,uint64_t *res)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint64_t uVar4;
  uint64_t *out;
  uint64_t uVar5;
  uint64_t x;
  uint64_t *os;
  uint32_t i_1;
  uint64_t m;
  uint64_t c1;
  uint64_t tmp [64];
  uint64_t c00;
  uint64_t res_j;
  uint64_t *resb;
  uint64_t c10;
  uint64_t r;
  uint64_t *res_i_15;
  uint64_t a_i2_15;
  uint64_t *res_i2_15;
  uint64_t a_i1_15;
  uint64_t *res_i1_15;
  uint64_t a_i0_15;
  uint64_t *res_i0_15;
  uint64_t a_i_15;
  uint64_t *res_i_14;
  uint64_t a_i2_14;
  uint64_t *res_i2_14;
  uint64_t a_i1_14;
  uint64_t *res_i1_14;
  uint64_t a_i0_14;
  uint64_t *res_i0_14;
  uint64_t a_i_14;
  uint64_t *res_i_13;
  uint64_t a_i2_13;
  uint64_t *res_i2_13;
  uint64_t a_i1_13;
  uint64_t *res_i1_13;
  uint64_t a_i0_13;
  uint64_t *res_i0_13;
  uint64_t a_i_13;
  uint64_t *res_i_12;
  uint64_t a_i2_12;
  uint64_t *res_i2_12;
  uint64_t a_i1_12;
  uint64_t *res_i1_12;
  uint64_t a_i0_12;
  uint64_t *res_i0_12;
  uint64_t a_i_12;
  uint64_t *res_i_11;
  uint64_t a_i2_11;
  uint64_t *res_i2_11;
  uint64_t a_i1_11;
  uint64_t *res_i1_11;
  uint64_t a_i0_11;
  uint64_t *res_i0_11;
  uint64_t a_i_11;
  uint64_t *res_i_10;
  uint64_t a_i2_10;
  uint64_t *res_i2_10;
  uint64_t a_i1_10;
  uint64_t *res_i1_10;
  uint64_t a_i0_10;
  uint64_t *res_i0_10;
  uint64_t a_i_10;
  uint64_t *res_i_9;
  uint64_t a_i2_9;
  uint64_t *res_i2_9;
  uint64_t a_i1_9;
  uint64_t *res_i1_9;
  uint64_t a_i0_9;
  uint64_t *res_i0_9;
  uint64_t a_i_9;
  uint64_t *res_i_8;
  uint64_t a_i2_8;
  uint64_t *res_i2_8;
  uint64_t a_i1_8;
  uint64_t *res_i1_8;
  uint64_t a_i0_8;
  uint64_t *res_i0_8;
  uint64_t a_i_8;
  uint64_t *res_i_7;
  uint64_t a_i2_7;
  uint64_t *res_i2_7;
  uint64_t a_i1_7;
  uint64_t *res_i1_7;
  uint64_t a_i0_7;
  uint64_t *res_i0_7;
  uint64_t a_i_7;
  uint64_t *res_i_6;
  uint64_t a_i2_6;
  uint64_t *res_i2_6;
  uint64_t a_i1_6;
  uint64_t *res_i1_6;
  uint64_t a_i0_6;
  uint64_t *res_i0_6;
  uint64_t a_i_6;
  uint64_t *res_i_5;
  uint64_t a_i2_5;
  uint64_t *res_i2_5;
  uint64_t a_i1_5;
  uint64_t *res_i1_5;
  uint64_t a_i0_5;
  uint64_t *res_i0_5;
  uint64_t a_i_5;
  uint64_t *res_i_4;
  uint64_t a_i2_4;
  uint64_t *res_i2_4;
  uint64_t a_i1_4;
  uint64_t *res_i1_4;
  uint64_t a_i0_4;
  uint64_t *res_i0_4;
  uint64_t a_i_4;
  uint64_t *res_i_3;
  uint64_t a_i2_3;
  uint64_t *res_i2_3;
  uint64_t a_i1_3;
  uint64_t *res_i1_3;
  uint64_t a_i0_3;
  uint64_t *res_i0_3;
  uint64_t a_i_3;
  uint64_t *res_i_2;
  uint64_t a_i2_2;
  uint64_t *res_i2_2;
  uint64_t a_i1_2;
  uint64_t *res_i1_2;
  uint64_t a_i0_2;
  uint64_t *res_i0_2;
  uint64_t a_i_2;
  uint64_t *res_i_1;
  uint64_t a_i2_1;
  uint64_t *res_i2_1;
  uint64_t a_i1_1;
  uint64_t *res_i1_1;
  uint64_t a_i0_1;
  uint64_t *res_i0_1;
  uint64_t a_i_1;
  uint64_t *res_i;
  uint64_t a_i2;
  uint64_t *res_i2;
  uint64_t a_i1;
  uint64_t *res_i1;
  uint64_t a_i0;
  uint64_t *res_i0;
  uint64_t a_i;
  uint32_t i;
  uint64_t c1_1;
  uint64_t *res_j0;
  uint64_t qj;
  ulong uStack_50;
  uint32_t i0;
  uint64_t c0;
  uint64_t *res_local;
  uint64_t *c_local;
  uint64_t nInv_local;
  uint64_t *n_local;
  
  uStack_50 = 0;
  for (qj._4_4_ = 0; qj._4_4_ < 0x40; qj._4_4_ = qj._4_4_ + 1) {
    uVar4 = nInv * c[qj._4_4_];
    out = c + qj._4_4_;
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(*n,uVar4,0,out);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[1],uVar4,uVar5,out + 1);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[2],uVar4,uVar5,out + 2);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[3],uVar4,uVar5,out + 3);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[4],uVar4,uVar5,out + 4);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[5],uVar4,uVar5,out + 5);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[6],uVar4,uVar5,out + 6);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[7],uVar4,uVar5,out + 7);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[8],uVar4,uVar5,out + 8);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[9],uVar4,uVar5,out + 9);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[10],uVar4,uVar5,out + 10);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0xb],uVar4,uVar5,out + 0xb);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0xc],uVar4,uVar5,out + 0xc);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0xd],uVar4,uVar5,out + 0xd);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0xe],uVar4,uVar5,out + 0xe);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0xf],uVar4,uVar5,out + 0xf);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x10],uVar4,uVar5,out + 0x10);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x11],uVar4,uVar5,out + 0x11);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x12],uVar4,uVar5,out + 0x12);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x13],uVar4,uVar5,out + 0x13);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x14],uVar4,uVar5,out + 0x14);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x15],uVar4,uVar5,out + 0x15);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x16],uVar4,uVar5,out + 0x16);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x17],uVar4,uVar5,out + 0x17);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x18],uVar4,uVar5,out + 0x18);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x19],uVar4,uVar5,out + 0x19);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x1a],uVar4,uVar5,out + 0x1a);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x1b],uVar4,uVar5,out + 0x1b);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x1c],uVar4,uVar5,out + 0x1c);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x1d],uVar4,uVar5,out + 0x1d);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x1e],uVar4,uVar5,out + 0x1e);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x1f],uVar4,uVar5,out + 0x1f);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x20],uVar4,uVar5,out + 0x20);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x21],uVar4,uVar5,out + 0x21);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x22],uVar4,uVar5,out + 0x22);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x23],uVar4,uVar5,out + 0x23);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x24],uVar4,uVar5,out + 0x24);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x25],uVar4,uVar5,out + 0x25);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x26],uVar4,uVar5,out + 0x26);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x27],uVar4,uVar5,out + 0x27);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x28],uVar4,uVar5,out + 0x28);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x29],uVar4,uVar5,out + 0x29);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x2a],uVar4,uVar5,out + 0x2a);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x2b],uVar4,uVar5,out + 0x2b);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x2c],uVar4,uVar5,out + 0x2c);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x2d],uVar4,uVar5,out + 0x2d);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x2e],uVar4,uVar5,out + 0x2e);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x2f],uVar4,uVar5,out + 0x2f);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x30],uVar4,uVar5,out + 0x30);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x31],uVar4,uVar5,out + 0x31);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x32],uVar4,uVar5,out + 0x32);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x33],uVar4,uVar5,out + 0x33);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x34],uVar4,uVar5,out + 0x34);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x35],uVar4,uVar5,out + 0x35);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x36],uVar4,uVar5,out + 0x36);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x37],uVar4,uVar5,out + 0x37);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x38],uVar4,uVar5,out + 0x38);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x39],uVar4,uVar5,out + 0x39);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x3a],uVar4,uVar5,out + 0x3a);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x3b],uVar4,uVar5,out + 0x3b);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x3c],uVar4,uVar5,out + 0x3c);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x3d],uVar4,uVar5,out + 0x3d);
    uVar5 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x3e],uVar4,uVar5,out + 0x3e);
    uVar4 = Hacl_Bignum_Base_mul_wide_add2_u64(n[0x3f],uVar4,uVar5,out + 0x3f);
    uVar1 = c[qj._4_4_ + 0x40];
    uVar2 = (ulong)((char)uStack_50 != '\0');
    uVar3 = uVar4 + uVar1;
    c[(ulong)qj._4_4_ + 0x40] = uVar3 + uVar2;
    uStack_50 = (ulong)(CARRY8(uVar4,uVar1) || CARRY8(uVar3,uVar2));
  }
  memcpy(res,c + 0x40,0x200);
  memset(&c1,0,0x200);
  Hacl_Bignum4096_sub(res,n,&c1);
  for (os._4_4_ = 0; os._4_4_ < 0x40; os._4_4_ = os._4_4_ + 1) {
    res[os._4_4_] =
         -uStack_50 & tmp[(ulong)os._4_4_ - 1] | (-uStack_50 ^ 0xffffffffffffffff) & res[os._4_4_];
  }
  return;
}

Assistant:

static inline void areduction(uint64_t *n, uint64_t nInv, uint64_t *c, uint64_t *res)
{
  uint64_t c0 = 0ULL;
  KRML_MAYBE_FOR4(i0,
    0U,
    4U,
    1U,
    uint64_t qj = nInv * c[i0];
    uint64_t *res_j0 = c + i0;
    uint64_t c1 = 0ULL;
    {
      uint64_t a_i = n[4U * 0U];
      uint64_t *res_i0 = res_j0 + 4U * 0U;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u64(a_i, qj, c1, res_i0);
      uint64_t a_i0 = n[4U * 0U + 1U];
      uint64_t *res_i1 = res_j0 + 4U * 0U + 1U;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u64(a_i0, qj, c1, res_i1);
      uint64_t a_i1 = n[4U * 0U + 2U];
      uint64_t *res_i2 = res_j0 + 4U * 0U + 2U;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u64(a_i1, qj, c1, res_i2);
      uint64_t a_i2 = n[4U * 0U + 3U];
      uint64_t *res_i = res_j0 + 4U * 0U + 3U;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u64(a_i2, qj, c1, res_i);
    }
    uint64_t r = c1;
    uint64_t c10 = r;
    uint64_t *resb = c + 4U + i0;
    uint64_t res_j = c[4U + i0];
    c0 = Lib_IntTypes_Intrinsics_add_carry_u64(c0, c10, res_j, resb););
  memcpy(res, c + 4U, 4U * sizeof (uint64_t));
  uint64_t c00 = c0;
  uint64_t tmp[4U] = { 0U };
  uint64_t c1 = Hacl_Bignum256_sub(res, n, tmp);
  KRML_MAYBE_UNUSED_VAR(c1);
  uint64_t m = 0ULL - c00;
  KRML_MAYBE_FOR4(i,
    0U,
    4U,
    1U,
    uint64_t *os = res;
    uint64_t x = (m & tmp[i]) | (~m & res[i]);
    os[i] = x;);
}